

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifySampleBuffers
          (SamplePosDistributionCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  long lVar1;
  float *pfVar2;
  ostringstream *poVar3;
  float fVar4;
  int width;
  int height;
  long lVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long *plVar11;
  TestLog *pTVar12;
  QualityWarning *this_00;
  size_type *psVar13;
  ConstPixelBufferAccess *pCVar14;
  ulong siglen;
  void *__buf;
  void *__buf_00;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *pAVar15;
  void *__buf_01;
  bool bVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  pointer pSVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar26;
  long lVar27;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  Surface errorMask;
  string local_368;
  Surface local_348;
  SampleAverageVerifier local_330;
  string local_318;
  LogImageSet local_2f8;
  string local_2b8;
  TextureFormat local_298;
  string local_290;
  ConstPixelBufferAccess local_270;
  LogImage local_248;
  long local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  void *pvVar25;
  
  pSVar20 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
            .super__Vector_impl_data._M_start;
  width = pSVar20->m_width;
  height = pSVar20->m_height;
  pTVar12 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
             super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248.m_name._M_dataplus._M_p = (pointer)&local_248.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"SampleBuffers","");
  local_2f8.m_name._M_dataplus._M_p = (pointer)&local_2f8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Image sample buffers","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_1b0,&local_248.m_name,&local_2f8.m_name);
  tcu::TestLog::startImageSet(pTVar12,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
    operator_delete(local_2f8.m_name._M_dataplus._M_p,
                    local_2f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
    operator_delete(local_248.m_name._M_dataplus._M_p,
                    local_248.m_name.field_2._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(resultBuffers->
                              super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(resultBuffers->
                             super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar27 = 0x10;
    lVar18 = 0;
    do {
      pTVar12 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                 super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ConstPixelBufferAccess *)local_1b0,(int)lVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x1cf69b0);
      local_2f8.m_name._M_dataplus._M_p = (pointer)&local_2f8.m_name.field_2;
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_2f8.m_name.field_2._M_allocated_capacity = *psVar13;
        local_2f8.m_name.field_2._8_8_ = plVar11[3];
      }
      else {
        local_2f8.m_name.field_2._M_allocated_capacity = *psVar13;
        local_2f8.m_name._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_2f8.m_name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ConstPixelBufferAccess *)local_1b0,(int)lVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x1c8773a);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_368.field_2._M_allocated_capacity = *psVar13;
        local_368.field_2._8_8_ = plVar11[3];
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      }
      else {
        local_368.field_2._M_allocated_capacity = *psVar13;
        local_368._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_368._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pSVar20 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2b8._M_dataplus._M_p = (pointer)0x300000008;
      pvVar25 = *(void **)((long)&pSVar20->m_width + lVar27);
      if (pvVar25 != (void *)0x0) {
        pvVar25 = *(void **)((long)pSVar20 + lVar27 + -8);
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_1b0,(TextureFormat *)&local_2b8,
                 *(int *)((long)pSVar20 + lVar27 + -0x10),*(int *)((long)pSVar20 + lVar27 + -0xc),1,
                 pvVar25);
      pCVar14 = (ConstPixelBufferAccess *)local_1b0;
      tcu::LogImage::LogImage
                (&local_248,&local_2f8.m_name,&local_368,(ConstPixelBufferAccess *)local_1b0,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_248,(int)pTVar12,__buf,(size_t)pCVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
        operator_delete(local_248.m_description._M_dataplus._M_p,
                        local_248.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
        operator_delete(local_248.m_name._M_dataplus._M_p,
                        local_248.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
        operator_delete(local_2f8.m_name._M_dataplus._M_p,
                        local_2f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_270.m_format != (TextureFormat)(local_270.m_size.m_data + 2)) {
        operator_delete((void *)local_270.m_format,local_270._16_8_ + 1);
      }
      lVar18 = lVar18 + 1;
      lVar27 = lVar27 + 0x18;
    } while (lVar18 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  tcu::TestLog::endImageSet
            (((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_1b0._0_8_ =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Verifying sample position range",0x1f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  if ((int)((ulong)((long)(resultBuffers->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(resultBuffers->
                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 < 1) {
    bVar16 = true;
  }
  else {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    bVar16 = true;
    lVar27 = 0;
    lVar18 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Verifying sample ",0x11)
      ;
      lVar18 = lVar18 + 1;
      std::ostream::operator<<(poVar3,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
      std::ostream::operator<<
                (poVar3,(int)((ulong)((long)(resultBuffers->
                                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(resultBuffers->
                                           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = &PTR_verify_0219ccb0;
      bVar9 = verifyImageWithVerifier
                        ((Surface *)
                         ((long)&((resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->m_width + lVar27),
                         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,
                         (Verifier *)local_1b0,false);
      bVar16 = (bool)(bVar16 & bVar9);
      lVar27 = lVar27 + 0x18;
    } while (lVar18 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  if (bVar16 == false) {
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Sample position verification failed.",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
  }
  tcu::Surface::Surface((Surface *)&local_330,width,height);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_348,
             ((long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_1b0);
  local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar25 = (void *)CONCAT44(local_330._20_4_,local_330.m_distanceThreshold);
  if (pvVar25 != (void *)0x0) {
    pvVar25 = (void *)CONCAT44(local_330._12_4_,local_330.m_numSamples);
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_248,
             (int)local_330.super_Verifier._vptr_Verifier,
             local_330.super_Verifier._vptr_Verifier._4_4_,1,pvVar25);
  local_248.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_248.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_248);
  local_1b0._0_8_ =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Verifying sample position uniqueness.",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  if (height < 1) {
    iVar26 = 0;
    bVar9 = true;
  }
  else {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    bVar9 = true;
    iVar26 = 0;
    iVar17 = 0;
    do {
      if (0 < width) {
        iVar23 = 0;
        do {
          pSVar20 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(resultBuffers->
                                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20)
                       >> 3) * -0x55555555) {
            lVar18 = 1;
            lVar27 = 0;
            do {
              uVar21 = *(uint *)(*(long *)(&pSVar20->m_width + lVar18 * 2) +
                                (long)(*(int *)((long)pSVar20 + lVar18 * 8 + -8) * iVar17 + iVar23)
                                * 4);
              *(float *)(CONCAT44(local_348.m_height,local_348.m_width) + lVar27 * 8) =
                   (float)(uVar21 >> 8 & 0xff) / 255.0;
              *(float *)(CONCAT44(local_348.m_height,local_348.m_width) + 4 + lVar27 * 8) =
                   (float)(uVar21 >> 0x10 & 0xff) / 255.0;
              lVar27 = lVar27 + 1;
              pSVar20 = (resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar18 = lVar18 + 3;
            } while (lVar27 < (int)((ulong)((long)(resultBuffers->
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pSVar20) >> 3) * -0x55555555);
          }
          if (0 < (int)((ulong)((long)(resultBuffers->
                                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(resultBuffers->
                                     super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
             ) {
            lVar27 = 1;
            bVar7 = 0;
            lVar18 = 0;
            do {
              lVar1 = lVar18 + 1;
              local_1b8 = lVar27;
              if (lVar1 < (int)((ulong)((long)(resultBuffers->
                                              super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(resultBuffers->
                                             super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555) {
                do {
                  if ((bool)(4 < iVar26 & bVar7)) break;
                  lVar5 = CONCAT44(local_348.m_height,local_348.m_width);
                  fVar4 = *(float *)(lVar5 + lVar18 * 8);
                  pfVar2 = (float *)(lVar5 + lVar27 * 8);
                  if ((fVar4 == *pfVar2) && (!NAN(fVar4) && !NAN(*pfVar2))) {
                    bVar8 = true;
                    do {
                      bVar6 = bVar8;
                      if (!bVar6) goto LAB_01466d6d;
                      fVar4 = *(float *)(lVar5 + 4 + lVar18 * 8);
                      pfVar2 = (float *)(lVar5 + 4 + lVar27 * 8);
                    } while ((fVar4 == *pfVar2) && (bVar8 = false, !NAN(fVar4) && !NAN(*pfVar2)));
                    if (!bVar6) {
LAB_01466d6d:
                      iVar26 = iVar26 + 1;
                      if (iVar26 < 6) {
                        local_1b0._0_8_ =
                             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                              super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream(poVar3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar3,"Pixel (",7);
                        std::ostream::operator<<(poVar3,iVar23);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2)
                        ;
                        std::ostream::operator<<(poVar3,iVar17);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar3,"): Samples ",0xb);
                        std::ostream::operator<<(poVar3,(int)lVar18);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar3," and ",5);
                        std::ostream::operator<<(poVar3,(int)lVar27);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar3," have the same position.",0x18);
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar3);
                        std::ios_base::~ios_base(local_138);
                      }
                      *(undefined4 *)
                       (CONCAT44(local_330._12_4_,local_330.m_numSamples) +
                       (long)((int)local_330.super_Verifier._vptr_Verifier * iVar17 + iVar23) * 4) =
                           0xff0000ff;
                      bVar7 = 1;
                      bVar9 = false;
                    }
                  }
                  lVar27 = lVar27 + 1;
                } while (lVar27 < (int)((ulong)((long)(resultBuffers->
                                                                                                            
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(resultBuffers->
                                                                                                          
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                  * -0x55555555);
              }
            } while ((lVar1 < (int)((ulong)((long)(resultBuffers->
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(resultBuffers->
                                                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              -0x55555555) &&
                    (lVar27 = local_1b8 + 1, lVar18 = lVar1, !(bool)(4 < iVar26 & bVar7)));
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 != width);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != height);
  }
  if (!bVar9) {
    if (5 < iVar26) {
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"...\n",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Omitted ",8);
      std::ostream::operator<<(poVar3,iVar26 + -5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," error descriptions.",0x14);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_138);
    }
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Image verification failed.",0x1a);
    pTVar12 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Verification","");
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Image Verification","");
    tcu::LogImageSet::LogImageSet(&local_2f8,&local_368,&local_318);
    tcu::TestLog::startImageSet
              (pTVar12,local_2f8.m_name._M_dataplus._M_p,local_2f8.m_description._M_dataplus._M_p);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ErrorMask","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Error Mask","");
    local_298.order = RGBA;
    local_298.type = UNORM_INT8;
    pvVar25 = (void *)CONCAT44(local_330._20_4_,local_330.m_distanceThreshold);
    if (pvVar25 != (void *)0x0) {
      pvVar25 = (void *)CONCAT44(local_330._12_4_,local_330.m_numSamples);
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_270,&local_298,
               (int)local_330.super_Verifier._vptr_Verifier,
               local_330.super_Verifier._vptr_Verifier._4_4_,1,pvVar25);
    pCVar14 = &local_270;
    tcu::LogImage::LogImage(&local_248,&local_2b8,&local_290,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_248,(int)pTVar12,__buf_00,(size_t)pCVar14);
    tcu::TestLog::endImageSet(pTVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
      operator_delete(local_248.m_description._M_dataplus._M_p,
                      local_248.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
      operator_delete(local_248.m_name._M_dataplus._M_p,
                      local_248.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
      operator_delete(local_2f8.m_description._M_dataplus._M_p,
                      local_2f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    bVar16 = false;
  }
  pvVar25 = (void *)CONCAT44(local_348.m_height,local_348.m_width);
  if (pvVar25 != (void *)0x0) {
    operator_delete(pvVar25,local_348.m_pixels.m_cap - (long)pvVar25);
  }
  tcu::Surface::~Surface((Surface *)&local_330);
  iVar26 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
  local_330.super_Verifier._vptr_Verifier = (_func_int **)&PTR_verify_0219cfe8;
  local_330.m_isStatisticallySignificant = 3 < iVar26;
  local_330.m_distanceThreshold = 1.0 / ((float)iVar26 * 12.0);
  local_330.m_numSamples = iVar26;
  if (local_330.m_distanceThreshold < 0.0) {
    local_330.m_distanceThreshold = sqrtf(local_330.m_distanceThreshold);
  }
  else {
    local_330.m_distanceThreshold = SQRT(local_330.m_distanceThreshold);
  }
  local_330.m_distanceThreshold = local_330.m_distanceThreshold + local_330.m_distanceThreshold;
  tcu::Surface::Surface(&local_348,width,height);
  local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar25 = (void *)local_348.m_pixels.m_cap;
  if ((void *)local_348.m_pixels.m_cap != (void *)0x0) {
    pvVar25 = local_348.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_248,local_348.m_width,
             local_348.m_height,1,pvVar25);
  local_248.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_248.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_248);
  if (iVar26 < 4) {
    bVar9 = false;
  }
  else {
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Verifying sample position distribution is (nearly) unbiased.",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    SampleAverageVerifier::logInfo
              (&local_330,
               ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                super_TestCase.super_TestNode.m_testCtx)->m_log);
    if (height < 1) {
      bVar9 = false;
      iVar26 = 0;
    }
    else {
      poVar3 = (ostringstream *)(local_1b0 + 8);
      iVar26 = 0;
      bVar9 = false;
      iVar17 = 0;
      do {
        if (0 < width) {
          iVar23 = 0;
          do {
            pSVar20 = (resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar21 = (int)((long)(resultBuffers->
                                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar20 >> 3) *
                     -0x55555555;
            iVar10 = 0;
            iVar19 = 0;
            siglen = 0;
            if (0 < (int)uVar21) {
              uVar22 = (ulong)(uVar21 & 0x7fffffff);
              siglen = 0;
              iVar19 = 0;
              iVar10 = 0;
              do {
                pAVar15 = &pSVar20->m_pixels;
                uVar21 = *(uint *)((long)pAVar15->m_ptr +
                                  (long)(*(int *)((long)(pAVar15 + -1) + 8) * iVar17 + iVar23) * 4);
                iVar10 = iVar10 + (uVar21 & 0xff);
                uVar24 = uVar21 >> 0x10 & 0xff;
                pvVar25 = (void *)(ulong)uVar24;
                iVar19 = iVar19 + uVar24;
                siglen = (ulong)((int)siglen + (uVar21 >> 8 & 0xff));
                pSVar20 = (pointer)(pAVar15 + 1);
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            uVar21 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                     m_numTargetSamples;
            local_1b0._0_4_ =
                 iVar19 / (int)uVar21 << 8 | iVar10 / (int)uVar21 |
                 (int)siglen / (int)uVar21 << 0x10;
            iVar10 = SampleAverageVerifier::verify
                               (&local_330,(EVP_PKEY_CTX *)local_1b0,
                                (uchar *)((long)(int)siglen % (long)(int)uVar21 & 0xffffffff),siglen
                                ,(uchar *)(ulong)uVar21,(size_t)pvVar25);
            if ((char)iVar10 == '\0') {
              iVar26 = iVar26 + 1;
              if (iVar26 < 6) {
                local_1b0._0_8_ =
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar3);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Pixel (",7);
                std::ostream::operator<<(poVar3,iVar23);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
                std::ostream::operator<<(poVar3,iVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar3,"): Sample distribution is biased.",0x21);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar3);
                std::ios_base::~ios_base(local_138);
              }
              *(undefined4 *)
               ((long)local_348.m_pixels.m_ptr + (long)(local_348.m_width * iVar17 + iVar23) * 4) =
                   0xff0000ff;
              bVar9 = true;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 != width);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != height);
    }
    if (bVar9) {
      if (5 < iVar26) {
        local_1b0._0_8_ =
             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Omitted ",8);
        std::ostream::operator<<(poVar3,iVar26 + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_138);
      }
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Image verification failed.",0x1a);
      pTVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Verification","");
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Image Verification","");
      tcu::LogImageSet::LogImageSet(&local_2f8,&local_368,&local_318);
      tcu::TestLog::startImageSet
                (pTVar12,local_2f8.m_name._M_dataplus._M_p,local_2f8.m_description._M_dataplus._M_p)
      ;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ErrorMask","");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Error Mask","");
      local_298.order = RGBA;
      local_298.type = UNORM_INT8;
      if ((void *)local_348.m_pixels.m_cap != (void *)0x0) {
        local_348.m_pixels.m_cap = (size_t)local_348.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_270,&local_298,local_348.m_width,local_348.m_height,1,
                 (void *)local_348.m_pixels.m_cap);
      pCVar14 = &local_270;
      tcu::LogImage::LogImage
                (&local_248,&local_2b8,&local_290,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_248,(int)pTVar12,__buf_01,(size_t)pCVar14);
      tcu::TestLog::endImageSet(pTVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
        operator_delete(local_248.m_description._M_dataplus._M_p,
                        local_248.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
        operator_delete(local_248.m_name._M_dataplus._M_p,
                        local_248.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
        operator_delete(local_2f8.m_description._M_dataplus._M_p,
                        local_2f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
        operator_delete(local_2f8.m_name._M_dataplus._M_p,
                        local_2f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_138);
    }
  }
  tcu::Surface::~Surface(&local_348);
  if (bVar16 != false) {
    if (bVar9) {
      this_00 = (QualityWarning *)__cxa_allocate_exception(0x30);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "Bias detected, sample positions are not uniformly distributed within the pixel",""
                );
      MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_00,(string *)local_1b0);
      __cxa_throw(this_00,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                  tcu::Exception::~Exception);
    }
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Verification ok.",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
  }
  return bVar16;
}

Assistant:

bool SamplePosDistributionCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;
	bool		distibutionError	= false;

	// Check sample range, uniqueness, and distribution, log layers
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// verify range
	{
		bool rangeOk = true;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position range" << tcu::TestLog::EndMessage;
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			rangeOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!rangeOk)
		{
			allOk = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Sample position verification failed." << tcu::TestLog::EndMessage;
		}
	}

	// Verify uniqueness
	{
		bool					uniquenessOk	= true;
		tcu::Surface			errorMask		(width, height);
		std::vector<tcu::Vec2>	samplePositions	(resultBuffers.size());
		int						printCount		= 0;
		const int				printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position uniqueness." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool samplePosNotUnique = false;

			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				samplePositions[sampleNdx] = tcu::Vec2((float)color.getGreen() / 255.0f, (float)color.getBlue() / 255.0f);
			}

			// Just check there are no two samples with same positions
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same position."
							<< tcu::TestLog::EndMessage;
					}

					samplePosNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	// check distribution
	{
		const SampleAverageVerifier verifier		(m_numTargetSamples);
		tcu::Surface				errorMask		(width, height);
		int							printCount		= 0;
		const int					printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// don't bother with small sample counts
		if (verifier.m_isStatisticallySignificant)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position distribution is (nearly) unbiased." << tcu::TestLog::EndMessage;
			verifier.logInfo(m_testCtx.getLog());

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				tcu::IVec3 colorSum(0, 0, 0);

				// color average

				for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
				{
					const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
					colorSum.x() += color.getRed();
					colorSum.y() += color.getBlue();
					colorSum.z() += color.getGreen();
				}

				colorSum.x() /= m_numTargetSamples;
				colorSum.y() /= m_numTargetSamples;
				colorSum.z() /= m_numTargetSamples;

				// verify average sample position

				if (!verifier.verify(tcu::RGBA(colorSum.x(), colorSum.y(), colorSum.z(), 0), tcu::IVec2(x, y)))
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Sample distribution is biased."
							<< tcu::TestLog::EndMessage;
					}

					distibutionError = true;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}

			// sub-verification result
			if (distibutionError)
			{
				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;

				m_testCtx.getLog()
					<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
					<< tcu::TestLog::ImageSet("Verification", "Image Verification")
					<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
					<< tcu::TestLog::EndImageSet;
			}
		}
	}

	// results
	if (!allOk)
		return false;
	else if (distibutionError)
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verification ok." << tcu::TestLog::EndMessage;
		return true;
	}
}